

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

string * __thiscall common_params_sampling::print_abi_cxx11_(common_params_sampling *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *__a;
  char result [1024];
  char *in_stack_fffffffffffffb98;
  allocator<char> local_419;
  char local_418 [1048];
  
  __a = (allocator<char> *)(double)*(float *)(in_RSI + 0x5c);
  snprintf(local_418,0x400,
           "\trepeat_last_n = %d, repeat_penalty = %.3f, frequency_penalty = %.3f, presence_penalty = %.3f\n\tdry_multiplier = %.3f, dry_base = %.3f, dry_allowed_length = %d, dry_penalty_last_n = %d\n\ttop_k = %d, top_p = %.3f, min_p = %.3f, xtc_probability = %.3f, xtc_threshold = %.3f, typical_p = %.3f, top_n_sigma = %.3f, temp = %.3f\n\tmirostat = %d, mirostat_lr = %.3f, mirostat_ent = %.3f"
           ,(double)*(float *)(in_RSI + 0x38),(double)*(float *)(in_RSI + 0x3c),
           (double)*(float *)(in_RSI + 0x40),(double)*(float *)(in_RSI + 0x44),
           (double)*(float *)(in_RSI + 0x48),(double)*(float *)(in_RSI + 0x14),
           (double)*(float *)(in_RSI + 0x18),(double)*(float *)(in_RSI + 0x1c),
           (ulong)*(uint *)(in_RSI + 0x34),(ulong)*(uint *)(in_RSI + 0x4c),
           (ulong)*(uint *)(in_RSI + 0x50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_stack_fffffffffffffb98,__a);
  std::allocator<char>::~allocator(&local_419);
  return in_RDI;
}

Assistant:

std::string common_params_sampling::print() const {
    char result[1024];

    snprintf(result, sizeof(result),
            "\trepeat_last_n = %d, repeat_penalty = %.3f, frequency_penalty = %.3f, presence_penalty = %.3f\n"
            "\tdry_multiplier = %.3f, dry_base = %.3f, dry_allowed_length = %d, dry_penalty_last_n = %d\n"
            "\ttop_k = %d, top_p = %.3f, min_p = %.3f, xtc_probability = %.3f, xtc_threshold = %.3f, typical_p = %.3f, top_n_sigma = %.3f, temp = %.3f\n"
            "\tmirostat = %d, mirostat_lr = %.3f, mirostat_ent = %.3f",
            penalty_last_n, penalty_repeat, penalty_freq, penalty_present,
            dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n,
            top_k, top_p, min_p, xtc_probability, xtc_threshold, typ_p, top_n_sigma, temp,
            mirostat, mirostat_eta, mirostat_tau);

    return std::string(result);
}